

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  int i;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  pointer pnVar3;
  int *piVar4;
  int iVar5;
  DataKey DVar6;
  long lVar7;
  pointer pnVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  steeppr *psVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  long lVar14;
  byte bVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_2d8;
  ulong local_2d0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  fpclass_type local_240;
  int32_t iStack_23c;
  cpp_dec_float<200U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  steeppr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar15 = 0;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar1->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = SUB1613((undefined1  [16])0x0,0);
  uStack_24b = 0;
  lVar14 = (long)(pSVar1->infeasibilities).super_IdxSet.num;
  if (lVar14 < 1) {
    DVar6.info = 0;
    DVar6.idx = -1;
  }
  else {
    lVar14 = lVar14 + 1;
    local_2d0 = 0xffffffff;
    local_2d8.info = 0;
    local_2d8.idx = 0;
    do {
      i = (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->infeasibilities).super_IdxSet.idx[lVar14 + -2];
      pnVar8 = pnVar2 + i;
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar10->data)._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
        pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar15 * -2 + 1) * 4);
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar15 * -8 + 4);
      }
      iStack_248 = pnVar2[i].m_backend.exp;
      bStack_244 = pnVar2[i].m_backend.neg;
      local_240 = pnVar2[i].m_backend.fpclass;
      iStack_23c = pnVar2[i].m_backend.prec_elem;
      pnVar9 = tol;
      pcVar10 = &local_230;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar10->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar15 * -2 + 1) * 4);
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar15 * -8 + 4);
      }
      local_230.exp = (tol->m_backend).exp;
      local_230.neg = (tol->m_backend).neg;
      local_230.fpclass = (tol->m_backend).fpclass;
      local_230.prec_elem = (tol->m_backend).prec_elem;
      if (local_230.data._M_elems[0] != 0 || local_230.fpclass != cpp_dec_float_finite) {
        local_230.neg = (bool)(local_230.neg ^ 1);
      }
      if (local_230.fpclass == cpp_dec_float_NaN || local_240 == cpp_dec_float_NaN) {
LAB_005b5d94:
        pSVar1 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        piVar4 = (pSVar1->infeasibilities).super_IdxSet.idx;
        iVar5 = (pSVar1->infeasibilities).super_IdxSet.num;
        (pSVar1->infeasibilities).super_IdxSet.num = iVar5 + -1;
        piVar4[lVar14 + -2] = piVar4[(long)iVar5 + -1];
        (pSVar1->isInfeasible).data[i] = 0;
      }
      else {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_2b8,&local_230);
        if (-1 < iVar5) goto LAB_005b5d94;
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
        psVar11 = local_b0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(uint *)psVar11 = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar15 * -8 + 4);
          psVar11 = psVar11 + (ulong)bVar15 * -8 + 4;
        }
        local_40 = iStack_248;
        local_3c = bStack_244;
        local_38 = local_240;
        iStack_34 = iStack_23c;
        pnVar8 = pnVar3 + i;
        pnVar9 = &local_130;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar9->m_backend).data._M_elems[0] = (pnVar8->m_backend).data._M_elems[0];
          pnVar8 = (pointer)((long)pnVar8 + ((ulong)bVar15 * -2 + 1) * 4);
          pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar9 + ((ulong)bVar15 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = pnVar3[i].m_backend.exp;
        local_130.m_backend.neg = pnVar3[i].m_backend.neg;
        local_130.m_backend.fpclass = pnVar3[i].m_backend.fpclass;
        local_130.m_backend.prec_elem = pnVar3[i].m_backend.prec_elem;
        pnVar9 = tol;
        pnVar12 = &local_1b0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
          pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)((long)pnVar9 + ((ulong)bVar15 * -2 + 1) * 4);
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar15 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (tol->m_backend).exp;
        local_1b0.m_backend.neg = (tol->m_backend).neg;
        local_1b0.m_backend.fpclass = (tol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (tol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_230,local_b0,&local_130,&local_1b0,&local_130);
        pcVar10 = &local_230;
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pcVar13->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + ((ulong)bVar15 * -2 + 1) * 4)
          ;
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar15 * -8 + 4);
        }
        iStack_248 = local_230.exp;
        bStack_244 = local_230.neg;
        local_240 = local_230.fpclass;
        iStack_23c = local_230.prec_elem;
        if (((local_230.fpclass != cpp_dec_float_NaN) &&
            ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_2b8,&best->m_backend),
           0 < iVar5)) {
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
          pnVar9 = best;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar9->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar15 * -8 + 4);
            pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar9 + ((ulong)bVar15 * -2 + 1) * 4);
          }
          (best->m_backend).exp = iStack_248;
          (best->m_backend).neg = bStack_244;
          (best->m_backend).fpclass = local_240;
          (best->m_backend).prec_elem = iStack_23c;
          local_2d8 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::coId((this->
                                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).thesolver,i);
          local_2d0 = (ulong)local_2d8 >> 0x20;
        }
      }
      lVar14 = lVar14 + -1;
    } while (1 < lVar14);
    DVar6 = (DataKey)((ulong)local_2d8 & 0xffffffff | local_2d0 << 0x20);
  }
  return (SPxId)DVar6;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterSparseDim(R& best, R tol)
{
   SPxId enterId;
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = coTest[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[idx], tol);

         if(x > best)
         {
            best = x;
            enterId = this->thesolver->coId(idx);
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   return enterId;
}